

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O3

void SerializeHDKeypaths<DataStream>
               (DataStream *s,
               map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
               *hd_keypaths,CompactSizeWriter type)

{
  undefined1 uVar1;
  KeyOriginInfo hd_keypath;
  size_t sVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  _Rb_tree_header *p_Var5;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff88;
  _Base_ptr p_Var6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var3 = (hd_keypaths->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(hd_keypaths->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      p_Var6 = p_Var3 + 1;
      uVar1 = (undefined1)p_Var3[1]._M_color;
      if ((uVar1 & 0xfe) == 2) {
        sVar2 = 0x21;
      }
      else {
        if ((1 < (byte)uVar1 - 6) && (uVar1 != 4)) {
          pcVar4 = (char *)__cxa_allocate_exception(0x20);
          std::iostream_category();
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar4,(error_code *)"Invalid CPubKey being serialized");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_003ab64b;
        }
        if ((byte)(uVar1 - 4) < 4) {
          sVar2 = *(size_t *)(&DAT_00808f98 + (ulong)(byte)(uVar1 - 4) * 8);
        }
        else {
          sVar2 = 0;
        }
      }
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                (s,(CompactSizeWriter *)&stack0xffffffffffffffa0,
                 (Span<const_unsigned_char> *)&stack0xffffffffffffff90);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_50,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var3[3]._M_left
                );
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = (int)p_Var6;
      hd_keypath.fingerprint[0] = (char)in_stack_ffffffffffffff88;
      hd_keypath.fingerprint[1] = (char)((ulong)in_stack_ffffffffffffff88 >> 8);
      hd_keypath.fingerprint[2] = (char)((ulong)in_stack_ffffffffffffff88 >> 0x10);
      hd_keypath.fingerprint[3] = (char)((ulong)in_stack_ffffffffffffff88 >> 0x18);
      hd_keypath._4_4_ = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = (int)((ulong)p_Var6 >> 0x20);
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)sVar2;
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)type.n;
      SerializeHDKeypath<DataStream>(s,hd_keypath);
      if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003ab64b:
  __stack_chk_fail();
}

Assistant:

void SerializeHDKeypaths(Stream& s, const std::map<CPubKey, KeyOriginInfo>& hd_keypaths, CompactSizeWriter type)
{
    for (const auto& keypath_pair : hd_keypaths) {
        if (!keypath_pair.first.IsValid()) {
            throw std::ios_base::failure("Invalid CPubKey being serialized");
        }
        SerializeToVector(s, type, Span{keypath_pair.first});
        SerializeHDKeypath(s, keypath_pair.second);
    }
}